

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O0

bool __thiscall ON_NurbsCage::IsPeriodic(ON_NurbsCage *this,int dir)

{
  bool bVar1;
  double *pointA;
  double *pointB;
  int local_48 [2];
  int d [3];
  int k;
  int j;
  int i;
  double *cv1;
  double *cv0;
  bool bIsPeriodic;
  int dir_local;
  ON_NurbsCage *this_local;
  
  cv0._3_1_ = false;
  if ((((-1 < dir) && (dir < 3)) && (0 < this->m_dim)) &&
     (cv0._3_1_ = ON_IsKnotVectorPeriodic
                            (this->m_order[dir],this->m_cv_count[dir],this->m_knot[dir]), cv0._3_1_)
     ) {
    memset(local_48,0,0xc);
    local_48[dir] = this->m_cv_count[dir] - (this->m_order[dir] + -1);
    for (k = 0; k + local_48[0] < this->m_cv_count[0]; k = k + 1) {
      for (d[2] = 0; d[2] + local_48[1] < this->m_cv_count[1]; d[2] = d[2] + 1) {
        for (d[1] = 0; d[1] + d[0] < this->m_cv_count[2]; d[1] = d[1] + 1) {
          pointA = CV(this,k,d[2],d[1]);
          pointB = CV(this,k + local_48[0],d[2] + local_48[1],d[1] + d[0]);
          bVar1 = ON_PointsAreCoincident(this->m_dim,(bool)(this->m_is_rat & 1),pointA,pointB);
          if (!bVar1) {
            return false;
          }
        }
      }
    }
  }
  return cv0._3_1_;
}

Assistant:

bool ON_NurbsCage::IsPeriodic(int dir) const
{
  bool bIsPeriodic = false;
  if ( dir >= 0 && dir <= 2 && m_dim > 0 )
  {
    bIsPeriodic = ON_IsKnotVectorPeriodic( m_order[dir], m_cv_count[dir], m_knot[dir] );
    if ( bIsPeriodic ) 
    {
      const double *cv0, *cv1;
      int i,j,k,d[3] = {0,0,0};
      d[dir] = m_cv_count[dir] - (m_order[dir]-1);
      for ( i = 0; i+d[0] < m_cv_count[0]; i++ )
      {
        for ( j = 0; j+d[1] < m_cv_count[1]; j++ )
        {
          for ( k = 0; k+d[2] < m_cv_count[2]; k++ )
          {
            cv0 = CV(i,j,k);
            cv1 = CV(i+d[0],j+d[1],k+d[2]);
            if ( false == ON_PointsAreCoincident(m_dim, m_is_rat, cv0, cv1 ) )
              return false;
          }
        }
      }
    }
  }
  return bIsPeriodic;
}